

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

JSONNode __thiscall JSONWorker::parse_unformatted(JSONWorker *this,json_string *json)

{
  char *pcVar1;
  invalid_argument *this_00;
  string *psVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  json_string *json_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)json);
  bVar5 = true;
  if (*pcVar1 != '{') {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)json);
    bVar5 = *pcVar1 == '[';
  }
  if (bVar5) {
    pcVar1 = (char *)std::__cxx11::string::data();
    lVar3 = std::__cxx11::string::data();
    lVar4 = std::__cxx11::string::length();
    _parse_unformatted(this,pcVar1,(char *)(lVar3 + lVar4));
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  psVar2 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::invalid_argument::invalid_argument(this_00,(string *)psVar2);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

json_throws(std::invalid_argument) {
    #if defined JSON_DEBUG || defined JSON_SAFE
	   #ifndef JSON_NO_EXCEPTIONS
		  JSON_ASSERT_SAFE((json[0] == JSON_TEXT('{')) || (json[0] == JSON_TEXT('[')), JSON_TEXT("Not JSON!"), throw std::invalid_argument(json_global(EMPTY_STD_STRING)););
	   #else
		  JSON_ASSERT_SAFE((json[0] == JSON_TEXT('{')) || (json[0] == JSON_TEXT('[')), JSON_TEXT("Not JSON!"), return JSONNode(JSON_NULL););
	   #endif
    #endif
	return _parse_unformatted(json.data(), json.data() + json.length());
}